

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

void Gia_ObjSetBufLevel(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  int l;
  
  if ((-1 < (int)(uint)*(undefined8 *)pObj) &&
     (uVar1 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar1 != 0x1fffffff)) {
    l = Gia_ObjLevel(p,pObj + -(ulong)uVar1);
    Gia_ObjSetLevel(p,pObj,l);
    return;
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x20d,"void Gia_ObjSetBufLevel(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline void         Gia_ObjSetBufLevel( Gia_Man_t * p, Gia_Obj_t * pObj ) { assert( Gia_ObjIsAnd(pObj) ); Gia_ObjSetLevel( p, pObj, Gia_ObjLevel(p,Gia_ObjFanin0(pObj)) );                                                }